

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void xmlListReverseWalk(xmlListPtr l,xmlListWalker walker,void *user)

{
  int iVar1;
  _xmlLink *local_28;
  xmlLinkPtr lk;
  void *user_local;
  xmlListWalker walker_local;
  xmlListPtr l_local;
  
  if ((l != (xmlListPtr)0x0) && (walker != (xmlListWalker)0x0)) {
    local_28 = l->sentinel->prev;
    while ((local_28 != l->sentinel && (iVar1 = (*walker)(local_28->data,user), iVar1 != 0))) {
      local_28 = local_28->prev;
    }
  }
  return;
}

Assistant:

void
xmlListReverseWalk(xmlListPtr l, xmlListWalker walker, void *user) {
    xmlLinkPtr lk;

    if ((l == NULL) || (walker == NULL))
        return;
    for(lk = l->sentinel->prev; lk != l->sentinel; lk = lk->prev) {
        if((walker(lk->data, user)) == 0)
                break;
    }
}